

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

int xmlACatalogRemove(xmlCatalogPtr catal,xmlChar *value)

{
  xmlCatalogEntryPtr catal_00;
  int iVar1;
  xmlChar *pxVar2;
  _xmlCatalogEntry *p_Var3;
  
  iVar1 = -1;
  if (value != (xmlChar *)0x0 && catal != (xmlCatalogPtr)0x0) {
    if (catal->type == XML_XML_CATALOG_TYPE) {
      catal_00 = catal->xml;
      if ((catal_00 != (xmlCatalogEntryPtr)0x0) && ((uint)(catal_00->type + XML_CATA_REMOVED) < 2))
      {
        p_Var3 = catal_00->children;
        if (p_Var3 != (_xmlCatalogEntry *)0x0) goto LAB_00164ff2;
        xmlFetchXMLCatalogFile(catal_00);
        for (p_Var3 = catal_00->children; p_Var3 != (_xmlCatalogEntry *)0x0; p_Var3 = p_Var3->next)
        {
LAB_00164ff2:
          if (((p_Var3->name != (xmlChar *)0x0) &&
              (iVar1 = xmlStrEqual(value,p_Var3->name), iVar1 != 0)) ||
             (iVar1 = xmlStrEqual(value,p_Var3->value), iVar1 != 0)) {
            if (xmlDebugCatalogs != 0) {
              pxVar2 = p_Var3->name;
              if (pxVar2 == (xmlChar *)0x0) {
                pxVar2 = p_Var3->value;
              }
              xmlCatalogPrintDebug("Removing element %s from catalog\n",pxVar2);
            }
            p_Var3->type = XML_CATA_REMOVED;
          }
        }
        iVar1 = 0;
      }
    }
    else {
      iVar1 = xmlHashRemoveEntry(catal->sgml,value,xmlFreeCatalogEntry);
      iVar1 = iVar1 + (uint)(iVar1 == 0);
    }
  }
  return iVar1;
}

Assistant:

int
xmlACatalogRemove(xmlCatalogPtr catal, const xmlChar *value) {
    int res = -1;

    if ((catal == NULL) || (value == NULL))
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	res = xmlDelXMLCatalog(catal->xml, value);
    } else {
	res = xmlHashRemoveEntry(catal->sgml, value, xmlFreeCatalogEntry);
	if (res == 0)
	    res = 1;
    }
    return(res);
}